

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkbox.cpp
# Opt level: O1

void __thiscall ftxui::anon_unknown_3::CheckboxBase::~CheckboxBase(CheckboxBase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  function<void_()> *pfVar2;
  Decorator *pDVar3;
  _Manager_type p_Var4;
  pointer pcVar5;
  
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__CheckboxBase_00174ec8;
  p_Var4 = (this->option_).owned_.on_change.super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    pfVar2 = &(this->option_).owned_.on_change;
    (*p_Var4)((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
  }
  p_Var4 = (this->option_).owned_.style_unfocused.super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    pDVar3 = &(this->option_).owned_.style_unfocused;
    (*p_Var4)((_Any_data *)pDVar3,(_Any_data *)pDVar3,__destroy_functor);
  }
  p_Var4 = (this->option_).owned_.style_focused.super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    pDVar3 = &(this->option_).owned_.style_focused;
    (*p_Var4)((_Any_data *)pDVar3,(_Any_data *)pDVar3,__destroy_functor);
  }
  pcVar5 = (this->option_).owned_.style_unchecked._M_dataplus._M_p;
  paVar1 = &(this->option_).owned_.style_unchecked.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  pcVar5 = (this->option_).owned_.style_checked._M_dataplus._M_p;
  paVar1 = &(this->option_).owned_.style_checked.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  pcVar5 = (this->label_).owned_._M_dataplus._M_p;
  paVar1 = &(this->label_).owned_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  ComponentBase::~ComponentBase(&this->super_ComponentBase);
  return;
}

Assistant:

CheckboxBase(ConstStringRef label, bool* state, Ref<CheckboxOption> option)
      : label_(label), state_(state), option_(std::move(option)) {
#if defined(FTXUI_MICROSOFT_TERMINAL_FALLBACK)
    // Microsoft terminal do not use fonts able to render properly the default
    // radiobox glyph.
    if (option_->style_checked == "▣ ")
      option_->style_checked = "[X]";
    if (option_->style_unchecked == "☐ ")
      option_->style_unchecked = "[ ]";
#endif
  }